

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

void replaceFormatNameInFieldList(FMStructDescList l,char *orig,char *repl,int repl_size)

{
  char *__haystack;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  FMFieldList p_Var7;
  long lVar8;
  long lVar9;
  char *old;
  FMFieldList *pp_Var10;
  int iVar11;
  
  if (l->format_name != (char *)0x0) {
    lVar8 = 0;
    do {
      p_Var7 = l[lVar8].field_list;
      pcVar6 = p_Var7->field_name;
      if (pcVar6 != (char *)0x0) {
        pp_Var10 = &l[lVar8].field_list;
        lVar9 = 0;
        iVar11 = 0;
        do {
          __haystack = p_Var7->field_type;
          pcVar2 = strstr(__haystack,orig);
          if (pcVar2 != (char *)0x0) {
            if (repl == (char *)0x0) {
              free(pcVar6);
              free((*pp_Var10)[lVar9].field_type);
              if ((*pp_Var10)[lVar9].field_name != (char *)0x0) {
                p_Var7 = *pp_Var10 + lVar9;
                do {
                  iVar1 = p_Var7[1].field_offset;
                  p_Var7->field_size = p_Var7[1].field_size;
                  p_Var7->field_offset = iVar1;
                  pcVar6 = p_Var7[1].field_type;
                  p_Var7->field_name = p_Var7[1].field_name;
                  p_Var7->field_type = pcVar6;
                  p_Var7 = *pp_Var10 + lVar9;
                } while (p_Var7->field_name != (char *)0x0);
              }
              iVar11 = iVar11 + -1;
            }
            else {
              sVar3 = strlen(__haystack);
              sVar4 = strlen(orig);
              sVar5 = strlen(repl);
              pcVar6 = (char *)malloc((sVar3 - sVar4) + sVar5 + 1);
              strncpy(pcVar6,__haystack,(long)pcVar2 - (long)__haystack);
              pcVar6[(long)pcVar2 - (long)__haystack] = '\0';
              strcat(pcVar6,repl);
              sVar3 = strlen(orig);
              strcat(pcVar6,pcVar2 + sVar3);
              free(__haystack);
              p_Var7 = *pp_Var10;
              p_Var7[lVar9].field_type = pcVar6;
              p_Var7[lVar9].field_size = repl_size;
            }
          }
          iVar11 = iVar11 + 1;
          lVar9 = (long)iVar11;
          p_Var7 = *pp_Var10 + lVar9;
          pcVar6 = p_Var7->field_name;
        } while (pcVar6 != (char *)0x0);
      }
      lVar8 = lVar8 + 1;
    } while (l[lVar8].format_name != (char *)0x0);
  }
  return;
}

Assistant:

static void replaceFormatNameInFieldList(FMStructDescList l, const char *orig, const char *repl,
                                         int repl_size)
{
    int i = 0;
    while (l[i].format_name)
    {
        int j = 0;
        while (l[i].field_list[j].field_name)
        {
            char *loc;
            if ((loc = strstr(l[i].field_list[j].field_type, orig)))
            {
                if (repl)
                {
                    /* replace 'orig' with 'repl' */
                    char *old = (char *)l[i].field_list[j].field_type;
                    char *new = malloc(strlen(old) - strlen(orig) + strlen(repl) + 1);
                    strncpy(new, old, loc - old);
                    new[loc - old] = 0;
                    strcat(new, repl);
                    strcat(new, loc + strlen(orig));
                    free(old);
                    l[i].field_list[j].field_type = new;
                    l[i].field_list[j].field_size = repl_size;
                }
                else
                {
                    /* remove list item with 'orig'  Move higher elements down 1
                     */
                    int index = j;
                    free((char *)l[i].field_list[j].field_name);
                    free((char *)l[i].field_list[j].field_type);
                    while (l[i].field_list[index].field_name != NULL)
                    {
                        l[i].field_list[index] = l[i].field_list[index + 1];
                    }
                    j--; /* we've replaced this element, make sure we process
                            the one we replaced it with */
                }
            }
            j++;
        }
        i++;
    }
}